

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_matrix.c
# Opt level: O1

void rq_matrix_get_dim(parameters *P,int n_ESIs,int *n_rows_out,int *n_cols_out)

{
  int iVar1;
  
  iVar1 = P->L;
  if (n_rows_out != (int *)0x0) {
    *n_rows_out = ((n_ESIs + P->Kprime) - P->K) + P->S + P->H;
  }
  if (n_cols_out != (int *)0x0) {
    *n_cols_out = iVar1;
  }
  return;
}

Assistant:

void rq_matrix_get_dim(const parameters* P,
			int n_ESIs,
			int* n_rows_out,
			int* n_cols_out)
{
	const int n_rows = n_ESIs + (P->Kprime - P->K) + P->S + P->H;
	const int n_cols = P->L;

	if (n_rows_out)
		*n_rows_out = n_rows;
	if (n_cols_out)
		*n_cols_out = n_cols;
}